

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int isoent_gen_joliet_identifier(archive_write *a,isoent *isoent,idr *idr)

{
  long lVar1;
  int iVar2;
  wchar_t wVar3;
  int *piVar4;
  uint *puVar5;
  char *pcVar6;
  long in_RSI;
  archive *in_RDI;
  size_t lt;
  int weight;
  int noff;
  int ext_off;
  uchar *dot;
  int parent_len;
  int ffmax;
  int r;
  size_t l;
  uchar *p;
  isoent *np;
  iso9660_conflict *iso9660;
  archive_rb_tree_ops *entry;
  size_t in_stack_ffffffffffffff80;
  isoent *in_stack_ffffffffffffff88;
  idr *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  uchar *local_58;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  uint uVar7;
  int local_48;
  idr *local_40;
  uchar *local_38;
  long local_30;
  int local_4;
  
  if (*(int *)(in_RSI + 0x38) == 0) {
    local_4 = 0;
  }
  else {
    lVar1 = *(long *)&in_RDI[1].current_codepage;
    if ((*(uint *)(lVar1 + 0x10370) >> 0x11 & 3) == 2) {
      local_48 = 0xce;
    }
    else {
      local_48 = 0x80;
    }
    entry = &isoent_gen_joliet_identifier::rb_ops;
    local_4 = idr_start((archive_write *)
                        CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                        in_stack_ffffffffffffff90,(int)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                        (int)in_stack_ffffffffffffff88,(int)(in_stack_ffffffffffffff80 >> 0x20),
                        (int)in_stack_ffffffffffffff80,
                        (archive_rb_tree_ops *)
                        CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    if (-1 < local_4) {
      uVar7 = 1;
      for (local_30 = in_RSI; *(long *)(local_30 + 0x20) != local_30;
          local_30 = *(long *)(local_30 + 0x20)) {
        uVar7 = *(int *)(local_30 + 0xbc) + 1 + uVar7;
      }
      for (local_30 = *(long *)(in_RSI + 0x28); local_30 != 0; local_30 = *(long *)(local_30 + 0x70)
          ) {
        local_40 = *(idr **)(*(long *)(local_30 + 0x18) + 0x60);
        if (local_48 < (int)local_40) {
          local_40 = (idr *)(long)local_48;
        }
        local_38 = (uchar *)malloc((long)((long)&local_40->idrent_pool + 1) * 2);
        if (local_38 == (uchar *)0x0) {
          archive_set_error(in_RDI,0xc,"Can\'t allocate memory");
          return -0x1e;
        }
        memcpy(local_38,*(void **)(*(long *)(local_30 + 0x18) + 0x58),(size_t)local_40);
        local_38[(long)local_40] = '\0';
        (local_38 + 1)[(long)local_40] = '\0';
        *(uchar **)(local_30 + 0xa8) = local_38;
        local_58 = local_38 + (long)local_40;
        for (in_stack_ffffffffffffff90 = local_40; in_stack_ffffffffffffff90 != (idr *)0x0;
            in_stack_ffffffffffffff90 = (idr *)(in_stack_ffffffffffffff90[-1].char_map + 0x7e)) {
          iVar2 = joliet_allowed_char(*local_38,local_38[1]);
          if (iVar2 == 0) {
            archive_be16enc(local_38,0x5f);
          }
          else if ((*local_38 == '\0') && (local_38[1] == '.')) {
            local_58 = local_38;
          }
          local_38 = local_38 + 2;
        }
        iVar2 = (int)local_58 - (int)*(undefined8 *)(local_30 + 0xa8);
        *(int *)(local_30 + 0xb0) = iVar2;
        *(int *)(local_30 + 0xb4) = (int)local_40 - iVar2;
        *(int *)(local_30 + 0xb8) = (int)local_40;
        if (local_48 < (int)*(undefined8 *)(*(long *)(local_30 + 0x18) + 0x60)) {
          wVar3 = archive_strncpy_l((archive_string *)0x0,in_stack_ffffffffffffff88,
                                    in_stack_ffffffffffffff80,(archive_string_conv *)entry);
          if ((wVar3 != L'\0') && (piVar4 = __errno_location(), *piVar4 == 0xc)) {
            puVar5 = (uint *)__errno_location();
            archive_set_error(in_RDI,(int)(ulong)*puVar5,"No memory");
            return -0x1e;
          }
          *(int *)(local_30 + 0xbc) = (int)*(undefined8 *)(lVar1 + 0x68);
        }
        else {
          *(int *)(local_30 + 0xbc) = (int)*(undefined8 *)(*(long *)(local_30 + 0x18) + 0x48);
        }
        if (0xf0 < (int)(uVar7 + *(int *)(local_30 + 0xbc))) {
          pcVar6 = archive_entry_pathname((archive_entry *)entry);
          archive_set_error(in_RDI,-1,
                            "The regulation of Joliet extensions; A length of a full-pathname of `%s\' is longer than 240 bytes, (p=%d, b=%d)"
                            ,pcVar6,(ulong)uVar7,(ulong)*(uint *)(local_30 + 0xbc));
          return -0x1e;
        }
        idr_register(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                     (int)(in_stack_ffffffffffffff80 >> 0x20),(int)in_stack_ffffffffffffff80);
      }
      idr_resolve(in_stack_ffffffffffffff90,(_func_void_uchar_ptr_int *)in_stack_ffffffffffffff88);
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static int
isoent_gen_joliet_identifier(struct archive_write *a, struct isoent *isoent,
    struct idr *idr)
{
	struct iso9660 *iso9660;
	struct isoent *np;
	unsigned char *p;
	size_t l;
	int r;
	int ffmax, parent_len;
	static const struct archive_rb_tree_ops rb_ops = {
		isoent_cmp_node_joliet, isoent_cmp_key_joliet
	};

	if (isoent->children.cnt == 0)
		return (0);

	iso9660 = a->format_data;
	if (iso9660->opt.joliet == OPT_JOLIET_LONGNAME)
		ffmax = 206;
	else
		ffmax = 128;

	r = idr_start(a, idr, isoent->children.cnt, ffmax, 6, 2, &rb_ops);
	if (r < 0)
		return (r);

	parent_len = 1;
	for (np = isoent; np->parent != np; np = np->parent)
		parent_len += np->mb_len + 1;

	for (np = isoent->children.first; np != NULL; np = np->chnext) {
		unsigned char *dot;
		int ext_off, noff, weight;
		size_t lt;

		if ((int)(l = np->file->basename_utf16.length) > ffmax)
			l = ffmax;

		p = malloc((l+1)*2);
		if (p == NULL) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory");
			return (ARCHIVE_FATAL);
		}
		memcpy(p, np->file->basename_utf16.s, l);
		p[l] = 0;
		p[l+1] = 0;

		np->identifier = (char *)p;
		lt = l;
		dot = p + l;
		weight = 0;
		while (lt > 0) {
			if (!joliet_allowed_char(p[0], p[1]))
				archive_be16enc(p, 0x005F); /* '_' */
			else if (p[0] == 0 && p[1] == 0x2E) /* '.' */
				dot = p;
			p += 2;
			lt -= 2;
		}
		ext_off = (int)(dot - (unsigned char *)np->identifier);
		np->ext_off = ext_off;
		np->ext_len = (int)l - ext_off;
		np->id_len = (int)l;

		/*
		 * Get a length of MBS of a full-pathname.
		 */
		if ((int)np->file->basename_utf16.length > ffmax) {
			if (archive_strncpy_l(&iso9660->mbs,
			    (const char *)np->identifier, l,
				iso9660->sconv_from_utf16be) != 0 &&
			    errno == ENOMEM) {
				archive_set_error(&a->archive, errno,
				    "No memory");
				return (ARCHIVE_FATAL);
			}
			np->mb_len = (int)iso9660->mbs.length;
			if (np->mb_len != (int)np->file->basename.length)
				weight = np->mb_len;
		} else
			np->mb_len = (int)np->file->basename.length;

		/* If a length of full-pathname is longer than 240 bytes,
		 * it violates Joliet extensions regulation. */
		if (parent_len + np->mb_len > 240) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "The regulation of Joliet extensions;"
			    " A length of a full-pathname of `%s' is "
			    "longer than 240 bytes, (p=%d, b=%d)",
			    archive_entry_pathname(np->file->entry),
			    (int)parent_len, (int)np->mb_len);
			return (ARCHIVE_FATAL);
		}

		/* Make an offset of the number which is used to be set
		 * hexadecimal number to avoid duplicate identifier. */
		if ((int)l == ffmax)
			noff = ext_off - 6;
		else if ((int)l == ffmax-2)
			noff = ext_off - 4;
		else if ((int)l == ffmax-4)
			noff = ext_off - 2;
		else
			noff = ext_off;
		/* Register entry to the identifier resolver. */
		idr_register(idr, np, weight, noff);
	}

	/* Resolve duplicate identifier with Joliet Volume. */
	idr_resolve(idr, idr_set_num_beutf16);

	return (ARCHIVE_OK);
}